

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExecuteProcessCommand.h
# Opt level: O0

cmCommand * __thiscall cmExecuteProcessCommand::Clone(cmExecuteProcessCommand *this)

{
  cmCommand *this_00;
  cmExecuteProcessCommand *this_local;
  
  this_00 = (cmCommand *)operator_new(0x30);
  cmExecuteProcessCommand((cmExecuteProcessCommand *)this_00);
  return this_00;
}

Assistant:

cmCommand* Clone() override { return new cmExecuteProcessCommand; }